

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# docopt_private.h
# Opt level: O0

bool __thiscall
docopt::LeafPattern::match
          (LeafPattern *this,PatternList *left,
          vector<std::shared_ptr<docopt::LeafPattern>,_std::allocator<std::shared_ptr<docopt::LeafPattern>_>_>
          *collected)

{
  bool bVar1;
  value *pvVar2;
  long lVar3;
  element_type *peVar4;
  string *__x;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *__x_00;
  __shared_ptr_access<docopt::LeafPattern,_(__gnu_cxx::_Lock_policy)2,_false,_false> *p_Var5;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_230;
  value local_218;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_1f0;
  value local_1d8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_1b0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_1a8;
  __normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  local_1a0;
  __normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  local_198;
  const_iterator local_190;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *local_188;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *list;
  value local_168;
  __normal_iterator<std::shared_ptr<docopt::LeafPattern>_*,_std::vector<std::shared_ptr<docopt::LeafPattern>,_std::allocator<std::shared_ptr<docopt::LeafPattern>_>_>_>
  local_140;
  undefined1 local_138 [8];
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  val_1;
  value local_f8;
  value local_d0;
  __normal_iterator<std::shared_ptr<docopt::LeafPattern>_*,_std::vector<std::shared_ptr<docopt::LeafPattern>,_std::allocator<std::shared_ptr<docopt::LeafPattern>_>_>_>
  local_a8;
  long local_a0;
  long val;
  shared_ptr<docopt::LeafPattern> *local_90;
  __normal_iterator<std::shared_ptr<docopt::LeafPattern>_*,_std::vector<std::shared_ptr<docopt::LeafPattern>,_std::allocator<std::shared_ptr<docopt::LeafPattern>_>_>_>
  local_88;
  __normal_iterator<std::shared_ptr<docopt::LeafPattern>_*,_std::vector<std::shared_ptr<docopt::LeafPattern>,_std::allocator<std::shared_ptr<docopt::LeafPattern>_>_>_>
  local_80;
  __normal_iterator<std::shared_ptr<docopt::LeafPattern>_*,_std::vector<std::shared_ptr<docopt::LeafPattern>,_std::allocator<std::shared_ptr<docopt::LeafPattern>_>_>_>
  same_name;
  __normal_iterator<std::shared_ptr<docopt::Pattern>_*,_std::vector<std::shared_ptr<docopt::Pattern>,_std::allocator<std::shared_ptr<docopt::Pattern>_>_>_>
  local_60;
  __normal_iterator<std::shared_ptr<docopt::Pattern>_*,_std::vector<std::shared_ptr<docopt::Pattern>,_std::allocator<std::shared_ptr<docopt::Pattern>_>_>_>
  local_58;
  const_iterator local_50;
  undefined4 local_44;
  undefined1 local_40 [8];
  pair<unsigned_long,_std::shared_ptr<docopt::LeafPattern>_> match;
  vector<std::shared_ptr<docopt::LeafPattern>,_std::allocator<std::shared_ptr<docopt::LeafPattern>_>_>
  *collected_local;
  PatternList *left_local;
  LeafPattern *this_local;
  
  match.second.super___shared_ptr<docopt::LeafPattern,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi
       = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)collected;
  (*(this->super_Pattern)._vptr_Pattern[8])(local_40,this,left);
  bVar1 = std::__shared_ptr::operator_cast_to_bool((__shared_ptr *)&match);
  if (bVar1) {
    local_60._M_current =
         (shared_ptr<docopt::Pattern> *)
         std::
         vector<std::shared_ptr<docopt::Pattern>,_std::allocator<std::shared_ptr<docopt::Pattern>_>_>
         ::begin(left);
    local_58 = __gnu_cxx::
               __normal_iterator<std::shared_ptr<docopt::Pattern>_*,_std::vector<std::shared_ptr<docopt::Pattern>,_std::allocator<std::shared_ptr<docopt::Pattern>_>_>_>
               ::operator+(&local_60,(difference_type)local_40);
    __gnu_cxx::
    __normal_iterator<std::shared_ptr<docopt::Pattern>const*,std::vector<std::shared_ptr<docopt::Pattern>,std::allocator<std::shared_ptr<docopt::Pattern>>>>
    ::__normal_iterator<std::shared_ptr<docopt::Pattern>*>
              ((__normal_iterator<std::shared_ptr<docopt::Pattern>const*,std::vector<std::shared_ptr<docopt::Pattern>,std::allocator<std::shared_ptr<docopt::Pattern>>>>
                *)&local_50,&local_58);
    same_name._M_current =
         (shared_ptr<docopt::LeafPattern> *)
         std::
         vector<std::shared_ptr<docopt::Pattern>,_std::allocator<std::shared_ptr<docopt::Pattern>_>_>
         ::erase(left,local_50);
    local_88._M_current =
         (shared_ptr<docopt::LeafPattern> *)
         std::
         vector<std::shared_ptr<docopt::LeafPattern>,_std::allocator<std::shared_ptr<docopt::LeafPattern>_>_>
         ::begin((vector<std::shared_ptr<docopt::LeafPattern>,_std::allocator<std::shared_ptr<docopt::LeafPattern>_>_>
                  *)match.second.super___shared_ptr<docopt::LeafPattern,_(__gnu_cxx::_Lock_policy)2>
                    ._M_refcount._M_pi);
    local_90 = (shared_ptr<docopt::LeafPattern> *)
               std::
               vector<std::shared_ptr<docopt::LeafPattern>,_std::allocator<std::shared_ptr<docopt::LeafPattern>_>_>
               ::end((vector<std::shared_ptr<docopt::LeafPattern>,_std::allocator<std::shared_ptr<docopt::LeafPattern>_>_>
                      *)match.second.
                        super___shared_ptr<docopt::LeafPattern,_(__gnu_cxx::_Lock_policy)2>.
                        _M_refcount._M_pi);
    val = (long)this;
    local_80 = std::
               find_if<__gnu_cxx::__normal_iterator<std::shared_ptr<docopt::LeafPattern>*,std::vector<std::shared_ptr<docopt::LeafPattern>,std::allocator<std::shared_ptr<docopt::LeafPattern>>>>,docopt::LeafPattern::match(std::vector<std::shared_ptr<docopt::Pattern>,std::allocator<std::shared_ptr<docopt::Pattern>>>&,std::vector<std::shared_ptr<docopt::LeafPattern>,std::allocator<std::shared_ptr<docopt::LeafPattern>>>&)const::_lambda(std::shared_ptr<docopt::LeafPattern>const&)_1_>
                         (local_88,(__normal_iterator<std::shared_ptr<docopt::LeafPattern>_*,_std::vector<std::shared_ptr<docopt::LeafPattern>,_std::allocator<std::shared_ptr<docopt::LeafPattern>_>_>_>
                                    )local_90,(anon_class_8_1_8991fb9c_for__M_pred)this);
    pvVar2 = getValue(this);
    bVar1 = value::isLong(pvVar2);
    if (bVar1) {
      local_a0 = 1;
      local_a8._M_current =
           (shared_ptr<docopt::LeafPattern> *)
           std::
           vector<std::shared_ptr<docopt::LeafPattern>,_std::allocator<std::shared_ptr<docopt::LeafPattern>_>_>
           ::end((vector<std::shared_ptr<docopt::LeafPattern>,_std::allocator<std::shared_ptr<docopt::LeafPattern>_>_>
                  *)match.second.super___shared_ptr<docopt::LeafPattern,_(__gnu_cxx::_Lock_policy)2>
                    ._M_refcount._M_pi);
      bVar1 = __gnu_cxx::operator==(&local_80,&local_a8);
      if (bVar1) {
        std::
        vector<std::shared_ptr<docopt::LeafPattern>,_std::allocator<std::shared_ptr<docopt::LeafPattern>_>_>
        ::push_back((vector<std::shared_ptr<docopt::LeafPattern>,_std::allocator<std::shared_ptr<docopt::LeafPattern>_>_>
                     *)match.second.
                       super___shared_ptr<docopt::LeafPattern,_(__gnu_cxx::_Lock_policy)2>.
                       _M_refcount._M_pi,(value_type *)&match);
        peVar4 = std::
                 __shared_ptr_access<docopt::LeafPattern,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                 ::operator->((__shared_ptr_access<docopt::LeafPattern,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                               *)&match);
        value::value(&local_d0,local_a0);
        setValue(peVar4,&local_d0);
        value::~value(&local_d0);
      }
      else {
        p_Var5 = (__shared_ptr_access<docopt::LeafPattern,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                  *)__gnu_cxx::
                    __normal_iterator<std::shared_ptr<docopt::LeafPattern>_*,_std::vector<std::shared_ptr<docopt::LeafPattern>,_std::allocator<std::shared_ptr<docopt::LeafPattern>_>_>_>
                    ::operator*(&local_80);
        peVar4 = std::
                 __shared_ptr_access<docopt::LeafPattern,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                 ::operator*(p_Var5);
        pvVar2 = getValue(peVar4);
        bVar1 = value::isLong(pvVar2);
        if (bVar1) {
          p_Var5 = (__shared_ptr_access<docopt::LeafPattern,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                    *)__gnu_cxx::
                      __normal_iterator<std::shared_ptr<docopt::LeafPattern>_*,_std::vector<std::shared_ptr<docopt::LeafPattern>,_std::allocator<std::shared_ptr<docopt::LeafPattern>_>_>_>
                      ::operator*(&local_80);
          peVar4 = std::
                   __shared_ptr_access<docopt::LeafPattern,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                   ::operator*(p_Var5);
          pvVar2 = getValue(peVar4);
          lVar3 = value::asLong(pvVar2);
          local_a0 = local_a0 + lVar3;
          p_Var5 = (__shared_ptr_access<docopt::LeafPattern,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                    *)__gnu_cxx::
                      __normal_iterator<std::shared_ptr<docopt::LeafPattern>_*,_std::vector<std::shared_ptr<docopt::LeafPattern>,_std::allocator<std::shared_ptr<docopt::LeafPattern>_>_>_>
                      ::operator*(&local_80);
          peVar4 = std::
                   __shared_ptr_access<docopt::LeafPattern,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                   ::operator*(p_Var5);
          value::value(&local_f8,local_a0);
          setValue(peVar4,&local_f8);
          value::~value(&local_f8);
        }
        else {
          p_Var5 = (__shared_ptr_access<docopt::LeafPattern,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                    *)__gnu_cxx::
                      __normal_iterator<std::shared_ptr<docopt::LeafPattern>_*,_std::vector<std::shared_ptr<docopt::LeafPattern>,_std::allocator<std::shared_ptr<docopt::LeafPattern>_>_>_>
                      ::operator*(&local_80);
          peVar4 = std::
                   __shared_ptr_access<docopt::LeafPattern,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                   ::operator*(p_Var5);
          value::value((value *)&val_1.
                                 super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                 ._M_impl.super__Vector_impl_data._M_end_of_storage,local_a0);
          setValue(peVar4,(value *)&val_1.
                                    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                    ._M_impl.super__Vector_impl_data._M_end_of_storage);
          value::~value((value *)&val_1.
                                  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                  ._M_impl.super__Vector_impl_data._M_end_of_storage);
        }
      }
    }
    else {
      pvVar2 = getValue(this);
      bVar1 = value::isStringList(pvVar2);
      if (bVar1) {
        std::
        vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  *)local_138);
        peVar4 = std::
                 __shared_ptr_access<docopt::LeafPattern,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                 ::operator->((__shared_ptr_access<docopt::LeafPattern,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                               *)&match);
        pvVar2 = getValue(peVar4);
        bVar1 = value::isString(pvVar2);
        if (bVar1) {
          peVar4 = std::
                   __shared_ptr_access<docopt::LeafPattern,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                   ::operator->((__shared_ptr_access<docopt::LeafPattern,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                                 *)&match);
          pvVar2 = getValue(peVar4);
          __x = value::asString_abi_cxx11_(pvVar2);
          std::
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::push_back((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                       *)local_138,__x);
        }
        else {
          peVar4 = std::
                   __shared_ptr_access<docopt::LeafPattern,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                   ::operator->((__shared_ptr_access<docopt::LeafPattern,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                                 *)&match);
          pvVar2 = getValue(peVar4);
          bVar1 = value::isStringList(pvVar2);
          if (bVar1) {
            peVar4 = std::
                     __shared_ptr_access<docopt::LeafPattern,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                     ::operator->((__shared_ptr_access<docopt::LeafPattern,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                                   *)&match);
            pvVar2 = getValue(peVar4);
            __x_00 = value::asStringList_abi_cxx11_(pvVar2);
            std::
            vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ::operator=((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         *)local_138,__x_00);
          }
        }
        local_140._M_current =
             (shared_ptr<docopt::LeafPattern> *)
             std::
             vector<std::shared_ptr<docopt::LeafPattern>,_std::allocator<std::shared_ptr<docopt::LeafPattern>_>_>
             ::end((vector<std::shared_ptr<docopt::LeafPattern>,_std::allocator<std::shared_ptr<docopt::LeafPattern>_>_>
                    *)match.second.
                      super___shared_ptr<docopt::LeafPattern,_(__gnu_cxx::_Lock_policy)2>.
                      _M_refcount._M_pi);
        bVar1 = __gnu_cxx::operator==(&local_80,&local_140);
        if (bVar1) {
          std::
          vector<std::shared_ptr<docopt::LeafPattern>,_std::allocator<std::shared_ptr<docopt::LeafPattern>_>_>
          ::push_back((vector<std::shared_ptr<docopt::LeafPattern>,_std::allocator<std::shared_ptr<docopt::LeafPattern>_>_>
                       *)match.second.
                         super___shared_ptr<docopt::LeafPattern,_(__gnu_cxx::_Lock_policy)2>.
                         _M_refcount._M_pi,(value_type *)&match);
          peVar4 = std::
                   __shared_ptr_access<docopt::LeafPattern,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                   ::operator->((__shared_ptr_access<docopt::LeafPattern,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                                 *)&match);
          std::
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    *)&list,(vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                             *)local_138);
          value::value(&local_168,
                       (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                        *)&list);
          setValue(peVar4,&local_168);
          value::~value(&local_168);
          std::
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     *)&list);
        }
        else {
          p_Var5 = (__shared_ptr_access<docopt::LeafPattern,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                    *)__gnu_cxx::
                      __normal_iterator<std::shared_ptr<docopt::LeafPattern>_*,_std::vector<std::shared_ptr<docopt::LeafPattern>,_std::allocator<std::shared_ptr<docopt::LeafPattern>_>_>_>
                      ::operator*(&local_80);
          peVar4 = std::
                   __shared_ptr_access<docopt::LeafPattern,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                   ::operator*(p_Var5);
          pvVar2 = getValue(peVar4);
          bVar1 = value::isStringList(pvVar2);
          if (bVar1) {
            p_Var5 = (__shared_ptr_access<docopt::LeafPattern,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                      *)__gnu_cxx::
                        __normal_iterator<std::shared_ptr<docopt::LeafPattern>_*,_std::vector<std::shared_ptr<docopt::LeafPattern>,_std::allocator<std::shared_ptr<docopt::LeafPattern>_>_>_>
                        ::operator*(&local_80);
            peVar4 = std::
                     __shared_ptr_access<docopt::LeafPattern,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                     ::operator*(p_Var5);
            pvVar2 = getValue(peVar4);
            local_188 = value::asStringList_abi_cxx11_(pvVar2);
            local_198._M_current =
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 std::
                 vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 ::begin((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                          *)local_138);
            __gnu_cxx::
            __normal_iterator<std::__cxx11::string_const*,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>
            ::__normal_iterator<std::__cxx11::string*>
                      ((__normal_iterator<std::__cxx11::string_const*,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>
                        *)&local_190,&local_198);
            local_1a0._M_current =
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 std::
                 vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 ::begin(local_188);
            local_1a8 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                        std::
                        vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                        ::end(local_188);
            local_1b0 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                        std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
                        insert<__gnu_cxx::__normal_iterator<std::__cxx11::string_const*,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>,void>
                                  ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>
                                    *)local_138,local_190,local_1a0,
                                   (__normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                                    )local_1a8);
            p_Var5 = (__shared_ptr_access<docopt::LeafPattern,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                      *)__gnu_cxx::
                        __normal_iterator<std::shared_ptr<docopt::LeafPattern>_*,_std::vector<std::shared_ptr<docopt::LeafPattern>,_std::allocator<std::shared_ptr<docopt::LeafPattern>_>_>_>
                        ::operator*(&local_80);
            peVar4 = std::
                     __shared_ptr_access<docopt::LeafPattern,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                     ::operator*(p_Var5);
            std::
            vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ::vector(&local_1f0,
                     (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      *)local_138);
            value::value(&local_1d8,&local_1f0);
            setValue(peVar4,&local_1d8);
            value::~value(&local_1d8);
            std::
            vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ::~vector(&local_1f0);
          }
          else {
            p_Var5 = (__shared_ptr_access<docopt::LeafPattern,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                      *)__gnu_cxx::
                        __normal_iterator<std::shared_ptr<docopt::LeafPattern>_*,_std::vector<std::shared_ptr<docopt::LeafPattern>,_std::allocator<std::shared_ptr<docopt::LeafPattern>_>_>_>
                        ::operator*(&local_80);
            peVar4 = std::
                     __shared_ptr_access<docopt::LeafPattern,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                     ::operator*(p_Var5);
            std::
            vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ::vector(&local_230,
                     (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      *)local_138);
            value::value(&local_218,&local_230);
            setValue(peVar4,&local_218);
            value::~value(&local_218);
            std::
            vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ::~vector(&local_230);
          }
        }
        std::
        vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   *)local_138);
      }
      else {
        std::
        vector<std::shared_ptr<docopt::LeafPattern>,_std::allocator<std::shared_ptr<docopt::LeafPattern>_>_>
        ::push_back((vector<std::shared_ptr<docopt::LeafPattern>,_std::allocator<std::shared_ptr<docopt::LeafPattern>_>_>
                     *)match.second.
                       super___shared_ptr<docopt::LeafPattern,_(__gnu_cxx::_Lock_policy)2>.
                       _M_refcount._M_pi,(value_type *)&match);
      }
    }
    this_local._7_1_ = true;
  }
  else {
    this_local._7_1_ = false;
  }
  local_44 = 1;
  std::pair<unsigned_long,_std::shared_ptr<docopt::LeafPattern>_>::~pair
            ((pair<unsigned_long,_std::shared_ptr<docopt::LeafPattern>_> *)local_40);
  return this_local._7_1_;
}

Assistant:

inline bool LeafPattern::match(PatternList& left, std::vector<std::shared_ptr<LeafPattern>>& collected) const
	{
		auto match = single_match(left);
		if (!match.second) {
			return false;
		}

		left.erase(left.begin()+static_cast<std::ptrdiff_t>(match.first));

		auto same_name = std::find_if(collected.begin(), collected.end(), [&](std::shared_ptr<LeafPattern> const& p) {
			return p->name()==name();
		});
		if (getValue().isLong()) {
			long val = 1;
			if (same_name == collected.end()) {
				collected.push_back(match.second);
				match.second->setValue(value{val});
			} else if ((**same_name).getValue().isLong()) {
				val += (**same_name).getValue().asLong();
				(**same_name).setValue(value{val});
			} else {
				(**same_name).setValue(value{val});
			}
		} else if (getValue().isStringList()) {
			std::vector<std::string> val;
			if (match.second->getValue().isString()) {
				val.push_back(match.second->getValue().asString());
			} else if (match.second->getValue().isStringList()) {
				val = match.second->getValue().asStringList();
			} else {
				/// cant be!?
			}

			if (same_name == collected.end()) {
				collected.push_back(match.second);
				match.second->setValue(value{val});
			} else if ((**same_name).getValue().isStringList()) {
				std::vector<std::string> const& list = (**same_name).getValue().asStringList();
				val.insert(val.begin(), list.begin(), list.end());
				(**same_name).setValue(value{val});
			} else {
				(**same_name).setValue(value{val});
			}
		} else {
			collected.push_back(match.second);
		}
		return true;
	}